

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::rebind::test_method(rebind *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *plVar4;
  service *psVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_id local_1a8;
  undefined8 local_1a0;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_188;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  undefined1 local_140 [8];
  injected<Inject::service> p2;
  undefined8 local_128;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined1 local_c8 [8];
  injected<Inject::service> p;
  context<0> c;
  provides<Inject::service> yy;
  component<Inject::impl2> y;
  provides<Inject::service> xxx;
  component<Inject::impl1> local_20;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  rebind *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&xx);
  inject::context<0>::component<Inject::impl1>::component(&local_20);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&y);
  inject::context<0>::component<Inject::impl2>::component((component<Inject::impl2> *)&yy);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)&p._ptr.pn);
  inject::context<0>::bind<Inject::service,Inject::impl1>((context<0> *)&p._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0xe1,&local_e8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_c8);
    iVar3 = (**psVar5->_vptr_service)();
    local_128 = CONCAT44(extraout_var,iVar3);
    p2._ptr.pn.pi_ = (sp_counted_base *)inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_110,&local_120,0xe1,1,2,&local_128,"p->id()",&p2._ptr.pn,"id_of<impl1>::id()")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::bind<Inject::service,Inject::impl2>((context<0> *)&p._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_140);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_160);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_150,0xe5,&local_160);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_188,plVar4,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar5 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_140);
    iVar3 = (**psVar5->_vptr_service)();
    local_1a0 = CONCAT44(extraout_var_00,iVar3);
    local_1a8 = inject::id_of<Inject::impl2>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_188,&local_198,0xe5,1,2,&local_1a0,"p2->id()",&local_1a8,"id_of<impl2>::id()")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_140);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_c8);
  inject::context<0>::~context((context<0> *)&p._ptr.pn);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::component<Inject::impl2>::~component((component<Inject::impl2> *)&yy);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&y);
  inject::context<0>::component<Inject::impl1>::~component(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&xx);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rebind)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<impl2> y;
    context<>::component<impl2>::provides<service> yy;

    context<> c;
    c.bind<service, impl1>();
    context<>::injected<service> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
    
    c.bind<service, impl2>();
    context<>::injected<service> p2;
    BOOST_CHECK_EQUAL(p2->id(), id_of<impl2>::id());
}